

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O2

void uv_pipe_connect(uv_connect_t *req,uv_pipe_t *handle,char *name,uv_connect_cb cb)

{
  anon_union_8_2_bf76bca6_for_active_reqs *paVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  sockaddr_un saddr;
  
  iVar2 = (handle->io_watcher).fd;
  if (iVar2 == -1) {
    iVar3 = uv__socket(1,1,0);
    if (iVar3 < 0) goto LAB_0017ebc8;
    (handle->io_watcher).fd = iVar3;
  }
  saddr.sun_path[0x5e] = '\0';
  saddr.sun_path[0x5f] = '\0';
  saddr.sun_path[0x60] = '\0';
  saddr.sun_path[0x61] = '\0';
  saddr.sun_path[0x62] = '\0';
  saddr.sun_path[99] = '\0';
  saddr.sun_path[100] = '\0';
  saddr.sun_path[0x65] = '\0';
  saddr.sun_path[0x66] = '\0';
  saddr.sun_path[0x67] = '\0';
  saddr.sun_path[0x68] = '\0';
  saddr.sun_path[0x69] = '\0';
  saddr.sun_path[0x6a] = '\0';
  saddr.sun_path[0x6b] = '\0';
  saddr.sun_path[0x4e] = '\0';
  saddr.sun_path[0x4f] = '\0';
  saddr.sun_path[0x50] = '\0';
  saddr.sun_path[0x51] = '\0';
  saddr.sun_path[0x52] = '\0';
  saddr.sun_path[0x53] = '\0';
  saddr.sun_path[0x54] = '\0';
  saddr.sun_path[0x55] = '\0';
  saddr.sun_path[0x56] = '\0';
  saddr.sun_path[0x57] = '\0';
  saddr.sun_path[0x58] = '\0';
  saddr.sun_path[0x59] = '\0';
  saddr.sun_path[0x5a] = '\0';
  saddr.sun_path[0x5b] = '\0';
  saddr.sun_path[0x5c] = '\0';
  saddr.sun_path[0x5d] = '\0';
  saddr.sun_path[0x3e] = '\0';
  saddr.sun_path[0x3f] = '\0';
  saddr.sun_path[0x40] = '\0';
  saddr.sun_path[0x41] = '\0';
  saddr.sun_path[0x42] = '\0';
  saddr.sun_path[0x43] = '\0';
  saddr.sun_path[0x44] = '\0';
  saddr.sun_path[0x45] = '\0';
  saddr.sun_path[0x46] = '\0';
  saddr.sun_path[0x47] = '\0';
  saddr.sun_path[0x48] = '\0';
  saddr.sun_path[0x49] = '\0';
  saddr.sun_path[0x4a] = '\0';
  saddr.sun_path[0x4b] = '\0';
  saddr.sun_path[0x4c] = '\0';
  saddr.sun_path[0x4d] = '\0';
  saddr.sun_path[0x2e] = '\0';
  saddr.sun_path[0x2f] = '\0';
  saddr.sun_path[0x30] = '\0';
  saddr.sun_path[0x31] = '\0';
  saddr.sun_path[0x32] = '\0';
  saddr.sun_path[0x33] = '\0';
  saddr.sun_path[0x34] = '\0';
  saddr.sun_path[0x35] = '\0';
  saddr.sun_path[0x36] = '\0';
  saddr.sun_path[0x37] = '\0';
  saddr.sun_path[0x38] = '\0';
  saddr.sun_path[0x39] = '\0';
  saddr.sun_path[0x3a] = '\0';
  saddr.sun_path[0x3b] = '\0';
  saddr.sun_path[0x3c] = '\0';
  saddr.sun_path[0x3d] = '\0';
  saddr.sun_path[0x1e] = '\0';
  saddr.sun_path[0x1f] = '\0';
  saddr.sun_path[0x20] = '\0';
  saddr.sun_path[0x21] = '\0';
  saddr.sun_path[0x22] = '\0';
  saddr.sun_path[0x23] = '\0';
  saddr.sun_path[0x24] = '\0';
  saddr.sun_path[0x25] = '\0';
  saddr.sun_path[0x26] = '\0';
  saddr.sun_path[0x27] = '\0';
  saddr.sun_path[0x28] = '\0';
  saddr.sun_path[0x29] = '\0';
  saddr.sun_path[0x2a] = '\0';
  saddr.sun_path[0x2b] = '\0';
  saddr.sun_path[0x2c] = '\0';
  saddr.sun_path[0x2d] = '\0';
  saddr.sun_path[0xe] = '\0';
  saddr.sun_path[0xf] = '\0';
  saddr.sun_path[0x10] = '\0';
  saddr.sun_path[0x11] = '\0';
  saddr.sun_path[0x12] = '\0';
  saddr.sun_path[0x13] = '\0';
  saddr.sun_path[0x14] = '\0';
  saddr.sun_path[0x15] = '\0';
  saddr.sun_path[0x16] = '\0';
  saddr.sun_path[0x17] = '\0';
  saddr.sun_path[0x18] = '\0';
  saddr.sun_path[0x19] = '\0';
  saddr.sun_path[0x1a] = '\0';
  saddr.sun_path[0x1b] = '\0';
  saddr.sun_path[0x1c] = '\0';
  saddr.sun_path[0x1d] = '\0';
  saddr.sun_family = 0;
  saddr.sun_path[0] = '\0';
  saddr.sun_path[1] = '\0';
  saddr.sun_path[2] = '\0';
  saddr.sun_path[3] = '\0';
  saddr.sun_path[4] = '\0';
  saddr.sun_path[5] = '\0';
  saddr.sun_path[6] = '\0';
  saddr.sun_path[7] = '\0';
  saddr.sun_path[8] = '\0';
  saddr.sun_path[9] = '\0';
  saddr.sun_path[10] = '\0';
  saddr.sun_path[0xb] = '\0';
  saddr.sun_path[0xc] = '\0';
  saddr.sun_path[0xd] = '\0';
  uv__strscpy(saddr.sun_path,name,0x6c);
  saddr.sun_family = 1;
  do {
    iVar3 = connect((handle->io_watcher).fd,(sockaddr *)&saddr,0x6e);
    if (iVar3 != -1) goto LAB_0017eb84;
    piVar4 = __errno_location();
    iVar3 = *piVar4;
  } while (iVar3 == 4);
  if (iVar3 == 0x73) {
LAB_0017eb84:
    if (iVar2 == -1) {
      iVar3 = uv__stream_open((uv_stream_t *)handle,(handle->io_watcher).fd,0xc000);
      if (iVar3 != 0) goto LAB_0017ebc8;
    }
    uv__io_start(handle->loop,&handle->io_watcher,4);
    iVar3 = 0;
  }
  else {
    iVar3 = -iVar3;
  }
LAB_0017ebc8:
  handle->delayed_error = iVar3;
  handle->connect_req = req;
  req->type = UV_CONNECT;
  paVar1 = &handle->loop->active_reqs;
  paVar1->count = paVar1->count + 1;
  req->handle = (uv_stream_t *)handle;
  req->cb = cb;
  req->queue[0] = req->queue;
  req->queue[1] = req->queue;
  if (iVar3 != 0) {
    uv__io_feed(handle->loop,&handle->io_watcher);
  }
  return;
}

Assistant:

void uv_pipe_connect(uv_connect_t* req,
                    uv_pipe_t* handle,
                    const char* name,
                    uv_connect_cb cb) {
  struct sockaddr_un saddr;
  int new_sock;
  int err;
  int r;

  new_sock = (uv__stream_fd(handle) == -1);

  if (new_sock) {
    err = uv__socket(AF_UNIX, SOCK_STREAM, 0);
    if (err < 0)
      goto out;
    handle->io_watcher.fd = err;
  }

  memset(&saddr, 0, sizeof saddr);
  uv__strscpy(saddr.sun_path, name, sizeof(saddr.sun_path));
  saddr.sun_family = AF_UNIX;

  do {
    r = connect(uv__stream_fd(handle),
                (struct sockaddr*)&saddr, sizeof saddr);
  }
  while (r == -1 && errno == EINTR);

  if (r == -1 && errno != EINPROGRESS) {
    err = UV__ERR(errno);
#if defined(__CYGWIN__) || defined(__MSYS__)
    /* EBADF is supposed to mean that the socket fd is bad, but
       Cygwin reports EBADF instead of ENOTSOCK when the file is
       not a socket.  We do not expect to see a bad fd here
       (e.g. due to new_sock), so translate the error.  */
    if (err == UV_EBADF)
      err = UV_ENOTSOCK;
#endif
    goto out;
  }

  err = 0;
  if (new_sock) {
    err = uv__stream_open((uv_stream_t*)handle,
                          uv__stream_fd(handle),
                          UV_HANDLE_READABLE | UV_HANDLE_WRITABLE);
  }

  if (err == 0)
    uv__io_start(handle->loop, &handle->io_watcher, POLLOUT);

out:
  handle->delayed_error = err;
  handle->connect_req = req;

  uv__req_init(handle->loop, req, UV_CONNECT);
  req->handle = (uv_stream_t*)handle;
  req->cb = cb;
  QUEUE_INIT(&req->queue);

  /* Force callback to run on next tick in case of error. */
  if (err)
    uv__io_feed(handle->loop, &handle->io_watcher);

}